

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aphy_impl.hpp
# Opt level: O2

ref<aphy::collision_shape> __thiscall
aphy::
makeObjectWithInterface<aphy::collision_shape,APhyBullet::BulletCollisionShape,btCapsuleShapeZ*>
          (aphy *this,btCapsuleShapeZ *args)

{
  pointer __p;
  BulletCollisionShape *this_00;
  undefined8 *puVar1;
  __uniq_ptr_impl<aphy::ref_counter<aphy::collision_shape>,_std::default_delete<aphy::ref_counter<aphy::collision_shape>_>_>
  local_20;
  
  this_00 = (BulletCollisionShape *)::operator_new(0x20);
  APhyBullet::BulletCollisionShape::BulletCollisionShape(this_00,(btCollisionShape *)args,Generic);
  puVar1 = (undefined8 *)::operator_new(0x18);
  *puVar1 = cppRefcountedDispatchTable;
  puVar1[1] = this_00;
  puVar1[2] = 1;
  (this_00->super_collision_shape).super_base_interface.myRefCounter = puVar1;
  local_20._M_t.
  super__Tuple_impl<0UL,_aphy::ref_counter<aphy::collision_shape>_*,_std::default_delete<aphy::ref_counter<aphy::collision_shape>_>_>
  .super__Head_base<0UL,_aphy::ref_counter<aphy::collision_shape>_*,_false>._M_head_impl =
       (tuple<aphy::ref_counter<aphy::collision_shape>_*,_std::default_delete<aphy::ref_counter<aphy::collision_shape>_>_>
        )(_Tuple_impl<0UL,_aphy::ref_counter<aphy::collision_shape>_*,_std::default_delete<aphy::ref_counter<aphy::collision_shape>_>_>
          )0x0;
  *(undefined8 **)this = puVar1;
  std::
  unique_ptr<aphy::ref_counter<aphy::collision_shape>,_std::default_delete<aphy::ref_counter<aphy::collision_shape>_>_>
  ::~unique_ptr((unique_ptr<aphy::ref_counter<aphy::collision_shape>,_std::default_delete<aphy::ref_counter<aphy::collision_shape>_>_>
                 *)&local_20);
  return (ref<aphy::collision_shape>)(Counter *)this;
}

Assistant:

inline ref<I> makeObjectWithInterface(Args... args)
{
    std::unique_ptr<T> object(new T(args...));
    std::unique_ptr<ref_counter<I>> counter(new ref_counter<I> (object.release()));
    return ref<I> (counter.release());
}